

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

VkResult glfwCreateWindowSurface
                   (VkInstance instance,GLFWwindow *handle,VkAllocationCallbacks *allocator,
                   VkSurfaceKHR *surface)

{
  GLFWbool GVar1;
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  _GLFWwindow *window;
  VkSurfaceKHR *in_stack_00000040;
  VkAllocationCallbacks *in_stack_00000048;
  _GLFWwindow *in_stack_00000050;
  VkInstance in_stack_00000058;
  VkResult local_4;
  
  *in_RCX = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = VK_ERROR_INITIALIZATION_FAILED;
  }
  else {
    GVar1 = _glfwInitVulkan(in_EDX);
    if (GVar1 == 0) {
      local_4 = VK_ERROR_INITIALIZATION_FAILED;
    }
    else if (_glfw.vk.extensions[0] == (char *)0x0) {
      _glfwInputError(0x10006,"Vulkan: Window surface creation extensions not found");
      local_4 = VK_ERROR_EXTENSION_NOT_PRESENT;
    }
    else if (*(int *)(in_RSI + 0x1f0) == 0) {
      local_4 = _glfwPlatformCreateWindowSurface
                          (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040);
    }
    else {
      _glfwInputError(0x10004,
                      "Vulkan: Window surface creation requires the window to have the client API set to GLFW_NO_API"
                     );
      local_4 = VK_ERROR_NATIVE_WINDOW_IN_USE_KHR;
    }
  }
  return local_4;
}

Assistant:

GLFWAPI VkResult glfwCreateWindowSurface(VkInstance instance,
                                         GLFWwindow* handle,
                                         const VkAllocationCallbacks* allocator,
                                         VkSurfaceKHR* surface)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(instance != VK_NULL_HANDLE);
    assert(window != NULL);
    assert(surface != NULL);

    *surface = VK_NULL_HANDLE;

    _GLFW_REQUIRE_INIT_OR_RETURN(VK_ERROR_INITIALIZATION_FAILED);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return VK_ERROR_INITIALIZATION_FAILED;

    if (!_glfw.vk.extensions[0])
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return VK_ERROR_EXTENSION_NOT_PRESENT;
    }

    if (window->context.client != GLFW_NO_API)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Vulkan: Window surface creation requires the window to have the client API set to GLFW_NO_API");
        return VK_ERROR_NATIVE_WINDOW_IN_USE_KHR;
    }

    return _glfwPlatformCreateWindowSurface(instance, window, allocator, surface);
}